

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::SetDamageDescriptionRecords
          (Entity_Damage_Status_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *DD)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  pointer pKVar4;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::operator=(&this->m_vDdRec,DD);
  pKVar4 = (DD->
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (DD->
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui16NumDmgDescRecs = (short)((uint)((int)pKVar2 - (int)pKVar4) >> 3) * -0x5555;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x18;
  for (; pKVar2 != pKVar4; pKVar4 = pKVar4 + 1) {
    KVar3 = DATA_TYPE::StandardVariable::GetRecordLength(pKVar4->m_pRef);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar3;
  }
  return;
}

Assistant:

void Entity_Damage_Status_PDU::SetDamageDescriptionRecords( const vector<StdVarPtr> & DD )
{
    m_vDdRec = DD;
    m_ui16NumDmgDescRecs = DD.size();
    m_ui16PDULength = ENTITY_DAMAGE_STATE_PDU;

    // Calculate new pdu length
    vector<StdVarPtr>::const_iterator citr = DD.begin();
    vector<StdVarPtr>::const_iterator citrEnd = DD.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetRecordLength();
    }
}